

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sortaddrinfo.c
# Opt level: O3

ares_status_t ares_sortaddrinfo(ares_channel_t *channel,ares_addrinfo_node *list_sentinel)

{
  ushort uVar1;
  sockaddr *addr;
  _func_int_ares_socket_t_sockaddr_ptr_ares_socklen_t_ptr_void_ptr *p_Var2;
  ares_addrinfo_node *paVar3;
  undefined4 uVar4;
  ares_conn_err_t aVar5;
  int iVar6;
  ares_addrinfo_node *paVar7;
  long *plVar8;
  size_t sVar9;
  size_t size;
  ares_status_t aVar10;
  ares_addrinfo_node **ppaVar11;
  size_t sVar12;
  size_t sVar13;
  size_t __nmemb;
  long *p;
  ares_socket_t sock;
  ares_socket_t local_5c;
  ares_channel_t *local_58;
  ares_socklen_t local_50;
  ares_socklen_t local_4c;
  long *local_48;
  size_t local_40;
  ares_addrinfo_node **local_38;
  
  paVar7 = list_sentinel->ai_next;
  aVar10 = ARES_ENODATA;
  if (paVar7 != (ares_addrinfo_node *)0x0) {
    ppaVar11 = &list_sentinel->ai_next;
    size = 0;
    __nmemb = 0;
    do {
      sVar12 = __nmemb;
      sVar9 = size;
      __nmemb = sVar12 + 1;
      paVar7 = paVar7->ai_next;
      size = sVar9 + 0x30;
    } while (paVar7 != (ares_addrinfo_node *)0x0);
    if (__nmemb != 0) {
      local_58 = channel;
      plVar8 = (long *)ares_malloc(size);
      if (plVar8 == (long *)0x0) {
        aVar10 = ARES_ENOMEM;
      }
      else {
        sVar13 = 0;
        local_48 = plVar8;
        local_40 = sVar12;
        local_38 = ppaVar11;
        do {
          paVar7 = *ppaVar11;
          if (paVar7 == (ares_addrinfo_node *)0x0) {
            __assert_fail("cur != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/c-ares[P]c-ares/src/lib/ares_sortaddrinfo.c"
                          ,0x1a7,
                          "ares_status_t ares_sortaddrinfo(ares_channel_t *, struct ares_addrinfo_node *)"
                         );
          }
          *plVar8 = (long)paVar7;
          plVar8[5] = sVar13;
          addr = paVar7->ai_addr;
          uVar1 = addr->sa_family;
          uVar4 = 0;
          if (uVar1 == 2) {
            local_50 = 0x10;
LAB_00116ac7:
            local_4c = local_50;
            aVar5 = ares_socket_open(&local_5c,local_58,(uint)uVar1,2,0x11);
            if (aVar5 != ARES_CONN_ERR_AFNOSUPPORT) {
              if (aVar5 == ARES_CONN_ERR_SUCCESS) {
                aVar5 = ares_socket_connect(local_58,local_5c,ARES_FALSE,addr,local_50);
                if (ARES_CONN_ERR_WOULDBLOCK < aVar5) {
                  ares_socket_close(local_58,local_5c);
                  goto LAB_00116b21;
                }
                p_Var2 = (local_58->sock_funcs).agetsockname;
                if ((p_Var2 != (_func_int_ares_socket_t_sockaddr_ptr_ares_socklen_t_ptr_void_ptr *)
                               0x0) &&
                   (iVar6 = (*p_Var2)(local_5c,(sockaddr *)((long)plVar8 + 0xc),&local_4c,
                                      local_58->sock_func_cb_data), iVar6 == 0)) {
                  ares_socket_close(local_58,local_5c);
                  uVar4 = 1;
                  goto LAB_00116b6e;
                }
                ares_socket_close(local_58,local_5c);
              }
              aVar10 = ARES_ENOTFOUND;
              p = local_48;
              goto LAB_00116c00;
            }
LAB_00116b21:
            uVar4 = 0;
          }
          else if (uVar1 == 10) {
            local_50 = 0x1c;
            goto LAB_00116ac7;
          }
LAB_00116b6e:
          p = local_48;
          *(undefined4 *)(plVar8 + 1) = uVar4;
          sVar13 = sVar13 + 1;
          ppaVar11 = &paVar7->ai_next;
          plVar8 = plVar8 + 6;
        } while (__nmemb != sVar13);
        qsort(local_48,__nmemb,0x30,rfc6724_compare);
        paVar7 = (ares_addrinfo_node *)*p;
        *local_38 = paVar7;
        sVar12 = local_40;
        plVar8 = p;
        if (__nmemb != 1) {
          do {
            paVar3 = (ares_addrinfo_node *)plVar8[6];
            paVar7->ai_next = paVar3;
            sVar12 = sVar12 - 1;
            paVar7 = paVar3;
            plVar8 = plVar8 + 6;
          } while (sVar12 != 0);
        }
        *(undefined8 *)(*(long *)((long)p + sVar9) + 0x20) = 0;
        aVar10 = ARES_SUCCESS;
LAB_00116c00:
        ares_free(p);
      }
    }
  }
  return aVar10;
}

Assistant:

ares_status_t ares_sortaddrinfo(ares_channel_t            *channel,
                                struct ares_addrinfo_node *list_sentinel)
{
  struct ares_addrinfo_node *cur;
  size_t                     nelem = 0;
  size_t                     i;
  int                        has_src_addr;
  struct addrinfo_sort_elem *elems;

  cur = list_sentinel->ai_next;
  while (cur) {
    ++nelem;
    cur = cur->ai_next;
  }

  if (!nelem) {
    return ARES_ENODATA;
  }

  elems = (struct addrinfo_sort_elem *)ares_malloc(
    nelem * sizeof(struct addrinfo_sort_elem));
  if (!elems) {
    return ARES_ENOMEM;
  }

  /*
   * Convert the linked list to an array that also contains the candidate
   * source address for each destination address.
   */
  for (i = 0, cur = list_sentinel->ai_next; i < nelem;
       ++i, cur   = cur->ai_next) {
    assert(cur != NULL);
    elems[i].ai             = cur;
    elems[i].original_order = i;
    has_src_addr = find_src_addr(channel, cur->ai_addr, &elems[i].src_addr.sa);
    if (has_src_addr == -1) {
      ares_free(elems);
      return ARES_ENOTFOUND;
    }
    elems[i].has_src_addr = (has_src_addr == 1) ? ARES_TRUE : ARES_FALSE;
  }

  /* Sort the addresses, and rearrange the linked list so it matches the sorted
   * order. */
  qsort((void *)elems, nelem, sizeof(struct addrinfo_sort_elem),
        rfc6724_compare);

  list_sentinel->ai_next = elems[0].ai;
  for (i = 0; i < nelem - 1; ++i) {
    elems[i].ai->ai_next = elems[i + 1].ai;
  }
  elems[nelem - 1].ai->ai_next = NULL;

  ares_free(elems);
  return ARES_SUCCESS;
}